

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O0

char * Granulator_GetSampleName(int index)

{
  GranulatorSample *pGVar1;
  GranulatorSample *s;
  MutexScopeLock mutexScope;
  char *pcStack_10;
  int index_local;
  
  if (index < 0) {
    pcStack_10 = "Input";
  }
  else {
    mutexScope.mutex._4_4_ = index;
    MutexScopeLock::MutexScopeLock((MutexScopeLock *)&s,(Mutex *)Granulator::sampleMutex,true);
    pGVar1 = Granulator::GetGranulatorSample(mutexScope.mutex._4_4_);
    if (pGVar1->numsamples == 0) {
      pcStack_10 = "Undefined";
    }
    else {
      pcStack_10 = pGVar1->name;
    }
    MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&s);
  }
  return pcStack_10;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API const char* Granulator_GetSampleName(int index)
{
    if (index < 0)
        return "Input";

    if (index < Granulator::MAXSAMPLE)
        ;
    {
        MutexScopeLock mutexScope(Granulator::sampleMutex);
        Granulator::GranulatorSample* s = &Granulator::GetGranulatorSample(index);
        if (s->numsamples == 0)
            return "Undefined";
        return s->name;
    }

    return "Undefined";
}